

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daemon.cpp
# Opt level: O0

void __thiscall Daemon::die_with_worker_status(Daemon *this,int status)

{
  ContextManager *pCVar1;
  char *pcVar2;
  uint __sig;
  string local_68;
  string local_38;
  undefined4 local_14;
  Daemon *pDStack_10;
  int status_local;
  Daemon *this_local;
  
  local_14 = status;
  pDStack_10 = this;
  if ((status & 0x7fU) == 0) {
    pCVar1 = ContextManager::get();
    format_abi_cxx11_(&local_38,"Worker exited with exitcode %d",(ulong)local_14._1_1_);
    (**pCVar1->_vptr_ContextManager)(pCVar1,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    pCVar1 = ContextManager::get();
    __sig = local_14 & 0x7f;
    pcVar2 = strsignal(__sig);
    format_abi_cxx11_(&local_68,"Worker was killed with signal %d (%s)",(ulong)__sig,pcVar2);
    (**pCVar1->_vptr_ContextManager)(pCVar1,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return;
}

Assistant:

void Daemon::die_with_worker_status(int status) {
    if (WIFEXITED(status)) {
        die(format("Worker exited with exitcode %d", WEXITSTATUS(status)));
    } else {
        die(format("Worker was killed with signal %d (%s)", WTERMSIG(status), strsignal(WTERMSIG(status))));
    }
}